

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# banman.cpp
# Opt level: O3

void __thiscall BanMan::LoadBanlist(BanMan *this)

{
  CClientUIInterface *this_00;
  bool bVar1;
  long lVar2;
  Logger *this_01;
  long lVar3;
  long in_FS_OFFSET;
  string_view logging_function;
  string_view logging_function_00;
  string_view source_file;
  string_view source_file_00;
  char *local_90;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock0;
  long *local_78 [2];
  long local_68 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  criticalblock0.super_unique_lock._M_owns = false;
  criticalblock0.super_unique_lock._M_device = (mutex_type *)this;
  std::unique_lock<std::mutex>::lock(&criticalblock0.super_unique_lock);
  this_00 = this->m_client_interface;
  if (this_00 != (CClientUIInterface *)0x0) {
    local_78[0] = local_68;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_78,anon_var_dwarf_14e7d38,anon_var_dwarf_14e7d38 + 0x12);
    if (G_TRANSLATION_FUN_abi_cxx11_.super__Function_base._M_manager == (_Manager_type)0x0) {
      local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_58,anon_var_dwarf_14e7d38,anon_var_dwarf_14e7d38 + 0x12);
    }
    else {
      local_90 = anon_var_dwarf_14e7d38;
      (*G_TRANSLATION_FUN_abi_cxx11_._M_invoker)
                (&local_58,(_Any_data *)&G_TRANSLATION_FUN_abi_cxx11_,&local_90);
    }
    CClientUIInterface::InitMessage(this_00,&local_58);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
    }
    if (local_78[0] != local_68) {
      operator_delete(local_78[0],local_68[0] + 1);
    }
  }
  lVar2 = std::chrono::_V2::steady_clock::now();
  bVar1 = CBanDB::Read(&this->m_ban_db,&this->m_banned);
  if (bVar1) {
    SweepBanned(this);
    this_01 = LogInstance();
    bVar1 = BCLog::Logger::WillLogCategoryLevel(this_01,NET,Debug);
    if (bVar1) {
      local_78[0] = (long *)(this->m_banned)._M_t._M_impl.super__Rb_tree_header._M_node_count;
      lVar3 = std::chrono::_V2::steady_clock::now();
      local_90 = (char *)((lVar3 - lVar2) / 1000000);
      logging_function._M_str = "LoadBanlist";
      logging_function._M_len = 0xb;
      source_file._M_str =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/banman.cpp"
      ;
      source_file._M_len = 0x5a;
      LogPrintFormatInternal<unsigned_long,long>
                (logging_function,source_file,0x28,NET,Debug,(ConstevalFormatString<2U>)0x81564d,
                 (unsigned_long *)local_78,(long *)&local_90);
    }
  }
  else {
    logging_function_00._M_str = "LoadBanlist";
    logging_function_00._M_len = 0xb;
    source_file_00._M_str =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/banman.cpp"
    ;
    source_file_00._M_len = 0x5a;
    LogPrintFormatInternal<>
              (logging_function_00,source_file_00,0x2a,ALL,Info,(ConstevalFormatString<0U>)0x81567c)
    ;
    std::
    _Rb_tree<CSubNet,std::pair<CSubNet_const,CBanEntry>,std::_Select1st<std::pair<CSubNet_const,CBanEntry>>,std::less<CSubNet>,std::allocator<std::pair<CSubNet_const,CBanEntry>>>
    ::_M_assign_unique<std::pair<CSubNet_const,CBanEntry>const*>
              ((_Rb_tree<CSubNet,std::pair<CSubNet_const,CBanEntry>,std::_Select1st<std::pair<CSubNet_const,CBanEntry>>,std::less<CSubNet>,std::allocator<std::pair<CSubNet_const,CBanEntry>>>
                *)&this->m_banned,(pair<const_CSubNet,_CBanEntry> *)0x0,
               (pair<const_CSubNet,_CBanEntry> *)0x0);
    this->m_is_dirty = true;
  }
  std::unique_lock<std::mutex>::~unique_lock(&criticalblock0.super_unique_lock);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void BanMan::LoadBanlist()
{
    LOCK(m_banned_mutex);

    if (m_client_interface) m_client_interface->InitMessage(_("Loading banlist…").translated);

    const auto start{SteadyClock::now()};
    if (m_ban_db.Read(m_banned)) {
        SweepBanned(); // sweep out unused entries

        LogDebug(BCLog::NET, "Loaded %d banned node addresses/subnets  %dms\n", m_banned.size(),
                 Ticks<std::chrono::milliseconds>(SteadyClock::now() - start));
    } else {
        LogPrintf("Recreating the banlist database\n");
        m_banned = {};
        m_is_dirty = true;
    }
}